

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O3

bool spvtools::opt::analysis::CompareAndPrintDifferences(DefUseManager *lhs,DefUseManager *rhs)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  bool bVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  _Base_ptr p_Var7;
  const_iterator cVar8;
  _Hash_node_base *p_Var9;
  IdToDefMap *__range3_1;
  IdToDefMap *__range3;
  InstToUsedIdsMap *__range3_2;
  value_type p;
  undefined1 local_58 [24];
  long local_40;
  
  bVar3 = std::__detail::
          _Equality<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::_M_equal((_Equality<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)lhs,(__hashtable *)rhs);
  if (!bVar3) {
    p_Var9 = (lhs->id_to_def_)._M_h._M_before_begin._M_nxt;
    if (p_Var9 != (_Hash_node_base *)0x0) {
      do {
        local_58._0_8_ = p_Var9[1]._M_nxt;
        local_58._8_8_ = p_Var9[2]._M_nxt;
        cVar5 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)rhs,(key_type *)local_58);
        if (cVar5.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
            ._M_cur == (__node_type *)0x0) {
          puts("Diff in id_to_def: missing value in rhs");
        }
        p_Var9 = p_Var9->_M_nxt;
      } while (p_Var9 != (_Hash_node_base *)0x0);
    }
    p_Var9 = (rhs->id_to_def_)._M_h._M_before_begin._M_nxt;
    if (p_Var9 != (_Hash_node_base *)0x0) {
      do {
        local_58._0_8_ = p_Var9[1]._M_nxt;
        local_58._8_8_ = p_Var9[2]._M_nxt;
        cVar5 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)lhs,(key_type *)local_58);
        if (cVar5.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
            ._M_cur == (__node_type *)0x0) {
          puts("Diff in id_to_def: missing value in lhs");
        }
        p_Var9 = p_Var9->_M_nxt;
      } while (p_Var9 != (_Hash_node_base *)0x0);
    }
  }
  if ((lhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (rhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>,std::_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>>
                      ((lhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>)
                       &(lhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header,
                       (rhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
    if (bVar4) goto LAB_00597551;
  }
  p_Var7 = (lhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(lhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      local_58._0_8_ = *(undefined8 *)(p_Var7 + 1);
      local_58._8_8_ = p_Var7[1]._M_parent;
      cVar6 = std::
              _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
              ::find(&(rhs->id_to_users_)._M_t,(key_type *)local_58);
      if ((_Rb_tree_header *)cVar6._M_node ==
          &(rhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header) {
        puts("Diff in id_to_users: missing value in rhs");
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  p_Var7 = (rhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(rhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 == p_Var2) {
    bVar3 = false;
  }
  else {
    do {
      local_58._0_8_ = *(undefined8 *)(p_Var7 + 1);
      local_58._8_8_ = p_Var7[1]._M_parent;
      cVar6 = std::
              _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
              ::find(&(lhs->id_to_users_)._M_t,(key_type *)local_58);
      if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
        puts("Diff in id_to_users: missing value in lhs");
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var2);
    bVar3 = false;
  }
LAB_00597551:
  bVar4 = std::__detail::
          _Equality<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::_M_equal((_Equality<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&lhs->inst_to_used_ids_,&(rhs->inst_to_used_ids_)._M_h);
  if (!bVar4) {
    p_Var9 = (lhs->inst_to_used_ids_)._M_h._M_before_begin._M_nxt;
    if (p_Var9 != (_Hash_node_base *)0x0) {
      do {
        local_58._0_8_ = p_Var9[1]._M_nxt;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_58 + 8),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(p_Var9 + 2));
        cVar8 = std::
                _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(rhs->inst_to_used_ids_)._M_h,(key_type *)local_58);
        if (cVar8.
            super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          puts("Diff in inst_to_used_ids: missing value in rhs");
        }
        if ((Instruction *)local_58._8_8_ != (Instruction *)0x0) {
          operator_delete((void *)local_58._8_8_,local_40 - local_58._8_8_);
        }
        p_Var9 = p_Var9->_M_nxt;
      } while (p_Var9 != (_Hash_node_base *)0x0);
    }
    p_Var9 = (rhs->inst_to_used_ids_)._M_h._M_before_begin._M_nxt;
    if (p_Var9 != (_Hash_node_base *)0x0) {
      do {
        local_58._0_8_ = p_Var9[1]._M_nxt;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_58 + 8),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(p_Var9 + 2));
        cVar8 = std::
                _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(lhs->inst_to_used_ids_)._M_h,(key_type *)local_58);
        if (cVar8.
            super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          puts("Diff in inst_to_used_ids: missing value in lhs");
        }
        if ((Instruction *)local_58._8_8_ != (Instruction *)0x0) {
          operator_delete((void *)local_58._8_8_,local_40 - local_58._8_8_);
        }
        p_Var9 = p_Var9->_M_nxt;
      } while (p_Var9 != (_Hash_node_base *)0x0);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CompareAndPrintDifferences(const DefUseManager& lhs,
                                const DefUseManager& rhs) {
  bool same = true;

  if (lhs.id_to_def_ != rhs.id_to_def_) {
    for (auto p : lhs.id_to_def_) {
      if (rhs.id_to_def_.find(p.first) == rhs.id_to_def_.end()) {
        printf("Diff in id_to_def: missing value in rhs\n");
      }
    }
    for (auto p : rhs.id_to_def_) {
      if (lhs.id_to_def_.find(p.first) == lhs.id_to_def_.end()) {
        printf("Diff in id_to_def: missing value in lhs\n");
      }
    }
    same = false;
  }

  if (lhs.id_to_users_ != rhs.id_to_users_) {
    for (auto p : lhs.id_to_users_) {
      if (rhs.id_to_users_.count(p) == 0) {
        printf("Diff in id_to_users: missing value in rhs\n");
      }
    }
    for (auto p : rhs.id_to_users_) {
      if (lhs.id_to_users_.count(p) == 0) {
        printf("Diff in id_to_users: missing value in lhs\n");
      }
    }
    same = false;
  }

  if (lhs.inst_to_used_ids_ != rhs.inst_to_used_ids_) {
    for (auto p : lhs.inst_to_used_ids_) {
      if (rhs.inst_to_used_ids_.count(p.first) == 0) {
        printf("Diff in inst_to_used_ids: missing value in rhs\n");
      }
    }
    for (auto p : rhs.inst_to_used_ids_) {
      if (lhs.inst_to_used_ids_.count(p.first) == 0) {
        printf("Diff in inst_to_used_ids: missing value in lhs\n");
      }
    }
    same = false;
  }

  return same;
}